

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O3

void __thiscall mjs::object::property::put(property *this,object *self,value *val)

{
  gc_heap *heap;
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  int *piVar4;
  initializer_list<mjs::value> __l;
  object_ptr a;
  value s;
  allocator_type local_109;
  gc_heap_ptr_untyped local_108;
  undefined1 local_f8 [8];
  anon_union_32_5_7b1e0779_for_value_3 local_f0;
  value local_d0;
  undefined1 local_a8 [48];
  wchar_t *local_78;
  value local_58;
  
  bVar1 = has_attributes(this->attributes_,read_only);
  if (bVar1) {
    __assert_fail("!has_attributes(attributes_, property_attribute::read_only)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                  ,0xf4,"void mjs::object::property::put(const object &, const value &)");
  }
  bVar1 = has_attributes(this->attributes_,accessor);
  if (bVar1) {
    heap = self->heap_;
    value_representation::get_value(&local_d0,&this->value_,heap);
    if (local_d0.type_ != object) {
      __assert_fail("type_ == value_type::object",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x46,"const object_ptr &mjs::value::object_value() const");
    }
    local_108.heap_ = (gc_heap *)local_d0.field_1.n_;
    local_108.pos_ =
         local_d0.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_;
    if (local_d0.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ !=
        (gc_heap *)0x0) {
      gc_heap::attach(local_d0.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.
                      super_gc_heap_ptr_untyped.heap_,&local_108);
    }
    value::destroy(&local_d0);
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&local_108);
    local_f8 = (undefined1  [8])0x3;
    local_f0.n_ = 8.38235727259426e-318;
    (**(code **)*puVar3)(&local_d0,puVar3);
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(&local_108);
    local_a8._40_8_ = 10;
    local_78 = L"__strict__";
    (**(code **)*puVar3)(local_f8,puVar3);
    if (local_f8._0_4_ != boolean) {
      __assert_fail("type_ == value_type::boolean",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x43,"bool mjs::value::boolean_value() const");
    }
    if (local_f0.b_ == true) {
      bVar1 = is_primitive_object(self);
    }
    else {
      bVar1 = false;
    }
    value::destroy((value *)local_f8);
    if (bVar1 == false) {
      gc_heap::unsafe_track<mjs::object>((gc_heap *)local_a8,(object *)heap);
      local_f8._0_4_ = object;
      local_f0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
           (gc_heap *)local_a8._0_8_;
      local_f0.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = local_a8._8_4_;
      if ((gc_heap *)local_a8._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_a8._0_8_,(gc_heap_ptr_untyped *)&local_f0.s_);
      }
    }
    else {
      (*self->_vptr_object[4])(local_f8,self);
    }
    value::value((value *)(local_a8 + 0x28),val);
    __l._M_len = 1;
    __l._M_array = (iterator)(local_a8 + 0x28);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_a8 + 0x10),__l,&local_109);
    call_function(&local_58,&local_d0,(value *)local_f8,
                  (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_a8 + 0x10));
    value::destroy(&local_58);
    std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
              ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_a8 + 0x10));
    value::destroy((value *)(local_a8 + 0x28));
    value::destroy((value *)local_f8);
    if (bVar1 == false) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_a8);
    }
    value::destroy(&local_d0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_108);
  }
  else {
    if (val->type_ == object) {
      gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(val->field_1).s_);
      class_name((object *)&local_d0);
      piVar4 = (int *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&local_d0);
      if (*piVar4 == 8) {
        iVar2 = wmemcmp(piVar4 + 1,L"Accessor",8);
        if (iVar2 == 0) {
          __assert_fail("val.type() != value_type::object || val.object_value()->class_name().view() != L\"Accessor\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                        ,0xfc,"void mjs::object::property::put(const object &, const value &)");
        }
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_d0);
    }
    value_representation::value_representation((value_representation *)&local_d0,val);
    (this->value_).repr_ = CONCAT44(local_d0._4_4_,local_d0.type_);
  }
  return;
}

Assistant:

void object::property::put(const object& self, const value& val) {
    assert(!has_attributes(attributes_, property_attribute::read_only));
    if (is_accessor()) {
        auto& h = self.heap();
        auto a = value_.get_value(h).object_value();
        auto s = a->get(L"set");
        const bool strict = a->get(L"__strict__").boolean_value() && is_primitive_object(self);
        call_function(s, strict ? self.internal_value() : value{h.unsafe_track(self)}, {val});
    } else {
        assert(val.type() != value_type::object || val.object_value()->class_name().view() != L"Accessor");
        raw_put(val);
    }
}